

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hh
# Opt level: O2

void __thiscall
MergeDecl::MergeDecl
          (MergeDecl *this,string *n,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *is)

{
  std::__cxx11::string::string((string *)this,(string *)n);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->inputs,is);
  return;
}

Assistant:

MergeDecl(std::string n, std::vector<std::string> is)
        : name(n)
        , inputs(is)
    {
    }